

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O0

void __thiscall
cnn::Node::forward(Node *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
                  Tensor *fx)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *pvVar4;
  value_type *pvVar5;
  Dim *in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_RDI;
  Tensor fx_elem;
  size_t i_1;
  size_t i;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs_ptrs;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> xs_elems;
  uint b;
  value_type *in_stack_fffffffffffffed8;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *this_00;
  undefined1 local_108 [44];
  uint in_stack_ffffffffffffff24;
  Tensor *in_stack_ffffffffffffff28;
  value_type *local_b8;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *local_58;
  undefined1 local_50 [24];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_38;
  uint local_1c;
  Dim *local_18;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = (*(code *)*(pointer *)
                     ((long)&(((in_RDI->
                               super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>).
                               _M_impl.super__Vector_impl_data._M_start)->bs).
                             super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl +
                     8))();
  if (((uVar3 & 1) == 0) && (uVar1 = Dim::batch_elems(local_18), uVar1 != 1)) {
    for (local_1c = 0; uVar1 = local_1c, uVar2 = Dim::batch_elems(local_18), uVar1 < uVar2;
        local_1c = local_1c + 1) {
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
                ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)0x3ad296);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::vector
                ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)0x3ad2a3);
      local_58 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)0x0;
      while (this_00 = local_58,
            pvVar4 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                     std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size
                               (local_10), this_00 < pvVar4) {
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                  (local_10,(size_type)local_58);
        Tensor::batch_elem(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::push_back
                  (this_00,in_stack_fffffffffffffed8);
        Tensor::~Tensor((Tensor *)0x3ad32c);
        local_58 = (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
                   ((long)&(local_58->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      local_b8 = (value_type *)0x0;
      while (in_stack_fffffffffffffed8 = local_b8,
            pvVar5 = (value_type *)
                     std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::size
                               (local_10), in_stack_fffffffffffffed8 < pvVar5) {
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                  (&local_38,(size_type)local_b8);
        std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::push_back
                  ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)this_00,
                   (value_type *)in_stack_fffffffffffffed8);
        local_b8 = (value_type *)((long)(local_b8->d).d + 1);
      }
      Tensor::batch_elem(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
      (*(code *)((in_RDI->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                 super__Vector_impl_data._M_start)->v)(in_RDI,local_50,local_108);
      Tensor::~Tensor((Tensor *)0x3ad428);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::~vector
                ((vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)in_RDI);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(in_RDI);
    }
  }
  else {
    (*(code *)((in_RDI->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
               super__Vector_impl_data._M_start)->v)(in_RDI,local_10,local_18);
  }
  return;
}

Assistant:

void Node::forward(const std::vector<const Tensor*>& xs,
                   Tensor& fx) const {
  if(this->supports_multibatch() || fx.d.batch_elems() == 1) {
    forward_impl(xs, fx);
  } else {
    for(unsigned b = 0; b < fx.d.batch_elems(); ++b) {
      std::vector<Tensor>  xs_elems;
      std::vector<const Tensor*> xs_ptrs;
      for(size_t i = 0; i < xs.size(); ++i) xs_elems.push_back(xs[i]->batch_elem(b));
      for(size_t i = 0; i < xs.size(); ++i) xs_ptrs.push_back(&xs_elems[i]);
      Tensor fx_elem(fx.batch_elem(b));
      forward_impl(xs_ptrs, fx_elem);
    }
  }
}